

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O1

void JsUtil::
     QuickSort<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>,_int_(*)(void_*,_const_void_*,_const_void_*)>
     ::Sort(WriteBarrierPtr<void> *base,size_t nmemb,size_t size,
           _func_int_void_ptr_void_ptr_void_ptr *comparer,void *context)

{
  int iVar1;
  ulong uVar2;
  WriteBarrierPtr<void> *pWVar3;
  WriteBarrierPtr<void> *pWVar4;
  WriteBarrierPtr<void> *pWVar5;
  WriteBarrierPtr<void> *b;
  ulong uVar6;
  WriteBarrierPtr<void> *pWVar7;
  ulong uVar8;
  size_t nmemb_00;
  WriteBarrierPtr<void> *b_00;
  WriteBarrierPtr<void> *pWVar9;
  WriteBarrierPtr<void> *pWVar10;
  
LAB_00b00412:
  if (base != (WriteBarrierPtr<void> *)0x0) {
    if (9 < nmemb) goto code_r0x00b00429;
    switch(nmemb) {
    case 2:
      iVar1 = (*comparer)(context,base + size,base);
      goto LAB_00b00f28;
    case 3:
      pWVar10 = base + size;
      iVar1 = (*comparer)(context,pWVar10,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar10,size);
      }
      iVar1 = (*comparer)(context,base + size * 2,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,base + size * 2,size);
      }
      iVar1 = (*comparer)(context,pWVar10,base);
LAB_00b00f28:
      pWVar9 = base + size;
      b_00 = base;
      break;
    case 4:
      b_00 = base + size;
      iVar1 = (*comparer)(context,b_00,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,b_00,size);
      }
      pWVar10 = base + size * 3;
      pWVar9 = base + size * 2;
      iVar1 = (*comparer)(context,pWVar10,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar10,size);
      }
      iVar1 = (*comparer)(context,pWVar9,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar10,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar10,size);
      }
      iVar1 = (*comparer)(context,pWVar9,b_00);
      break;
    case 5:
      b_00 = base + size;
      iVar1 = (*comparer)(context,b_00,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,b_00,size);
      }
      pWVar7 = base + size * 4;
      pWVar10 = base + size * 3;
      iVar1 = (*comparer)(context,pWVar7,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar7,size);
      }
      pWVar9 = base + size * 2;
      iVar1 = (*comparer)(context,pWVar7,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar7,size);
      }
      iVar1 = (*comparer)(context,pWVar10,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar10,size);
      }
      iVar1 = (*comparer)(context,pWVar10,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar10,size);
      }
      iVar1 = (*comparer)(context,pWVar9,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar7,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar7,size);
      }
      iVar1 = (*comparer)(context,pWVar10,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar10,size);
      }
      iVar1 = (*comparer)(context,pWVar9,b_00);
      break;
    case 6:
      b_00 = base + size * 2;
      pWVar10 = base + size;
      iVar1 = (*comparer)(context,b_00,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,b_00,size);
      }
      iVar1 = (*comparer)(context,b_00,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,b_00,size);
      }
      iVar1 = (*comparer)(context,pWVar10,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar10,size);
      }
      pWVar7 = base + size * 5;
      pWVar3 = base + size * 4;
      iVar1 = (*comparer)(context,pWVar7,pWVar3);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar3,pWVar7,size);
      }
      pWVar9 = base + size * 3;
      iVar1 = (*comparer)(context,pWVar7,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar7,size);
      }
      iVar1 = (*comparer)(context,pWVar3,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar9,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar3,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar7,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar7,size);
      }
      iVar1 = (*comparer)(context,pWVar3,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar9,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar9,b_00);
      break;
    case 7:
      b_00 = base + size * 2;
      pWVar10 = base + size;
      iVar1 = (*comparer)(context,b_00,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,b_00,size);
      }
      iVar1 = (*comparer)(context,b_00,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,b_00,size);
      }
      iVar1 = (*comparer)(context,pWVar10,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar10,size);
      }
      pWVar7 = base + size * 4;
      pWVar9 = base + size * 3;
      iVar1 = (*comparer)(context,pWVar7,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar7,size);
      }
      pWVar4 = base + size * 6;
      pWVar3 = base + size * 5;
      iVar1 = (*comparer)(context,pWVar4,pWVar3);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar3,pWVar4,size);
      }
      iVar1 = (*comparer)(context,pWVar3,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar4,pWVar7);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar7,pWVar4,size);
      }
      iVar1 = (*comparer)(context,pWVar3,pWVar7);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar7,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar7,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar7,size);
      }
      iVar1 = (*comparer)(context,pWVar9,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar3,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar4,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar4,size);
      }
      iVar1 = (*comparer)(context,pWVar3,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar9,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar7,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar7,size);
      }
      iVar1 = (*comparer)(context,pWVar9,b_00);
      break;
    case 8:
      pWVar10 = base + size;
      iVar1 = (*comparer)(context,pWVar10,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar10,size);
      }
      b_00 = base + size * 3;
      pWVar7 = base + size * 2;
      iVar1 = (*comparer)(context,b_00,pWVar7);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar7,b_00,size);
      }
      iVar1 = (*comparer)(context,pWVar7,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar7,size);
      }
      iVar1 = (*comparer)(context,b_00,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,b_00,size);
      }
      iVar1 = (*comparer)(context,pWVar7,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar7,size);
      }
      pWVar3 = base + size * 5;
      pWVar9 = base + size * 4;
      iVar1 = (*comparer)(context,pWVar3,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar3,size);
      }
      pWVar4 = base + size * 7;
      pWVar5 = base + size * 6;
      iVar1 = (*comparer)(context,pWVar4,pWVar5);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar5,pWVar4,size);
      }
      iVar1 = (*comparer)(context,pWVar5,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar5,size);
      }
      iVar1 = (*comparer)(context,pWVar4,pWVar3);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar3,pWVar4,size);
      }
      iVar1 = (*comparer)(context,pWVar5,pWVar3);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar3,pWVar5,size);
      }
      iVar1 = (*comparer)(context,pWVar9,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar3,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar9,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar5,pWVar7);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar7,pWVar5,size);
      }
      iVar1 = (*comparer)(context,pWVar4,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar4,size);
      }
      iVar1 = (*comparer)(context,pWVar5,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar5,size);
      }
      iVar1 = (*comparer)(context,pWVar9,pWVar7);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar7,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar3,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar9,b_00);
      break;
    case 9:
      pWVar10 = base + size;
      iVar1 = (*comparer)(context,pWVar10,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar10,size);
      }
      pWVar3 = base + size * 4;
      pWVar7 = base + size * 3;
      iVar1 = (*comparer)(context,pWVar3,pWVar7);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar7,pWVar3,size);
      }
      pWVar4 = base + size * 7;
      pWVar9 = base + size * 6;
      iVar1 = (*comparer)(context,pWVar4,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar4,size);
      }
      pWVar5 = base + size * 2;
      iVar1 = (*comparer)(context,pWVar5,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar5,size);
      }
      b_00 = base + size * 5;
      iVar1 = (*comparer)(context,b_00,pWVar3);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar3,b_00,size);
      }
      b = base + size * 8;
      iVar1 = (*comparer)(context,b,pWVar4);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar4,b,size);
      }
      iVar1 = (*comparer)(context,pWVar10,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar10,size);
      }
      iVar1 = (*comparer)(context,pWVar3,pWVar7);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar7,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar4,pWVar9);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar9,pWVar4,size);
      }
      iVar1 = (*comparer)(context,pWVar7,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar7,size);
      }
      iVar1 = (*comparer)(context,pWVar9,pWVar7);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar7,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar7,base);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (base,pWVar7,size);
      }
      iVar1 = (*comparer)(context,pWVar3,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar4,pWVar3);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar3,pWVar4,size);
      }
      iVar1 = (*comparer)(context,pWVar3,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar3,size);
      }
      iVar1 = (*comparer)(context,b_00,pWVar5);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar5,b_00,size);
      }
      iVar1 = (*comparer)(context,b,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,b,size);
      }
      iVar1 = (*comparer)(context,b_00,pWVar5);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar5,b_00,size);
      }
      iVar1 = (*comparer)(context,pWVar7,pWVar10);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,pWVar7,size);
      }
      iVar1 = (*comparer)(context,pWVar4,b_00);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (b_00,pWVar4,size);
      }
      iVar1 = (*comparer)(context,pWVar9,pWVar5);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar5,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar9,pWVar3);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar3,pWVar9,size);
      }
      iVar1 = (*comparer)(context,pWVar3,pWVar5);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar5,pWVar3,size);
      }
      iVar1 = (*comparer)(context,pWVar7,pWVar5);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar5,pWVar7,size);
      }
      iVar1 = (*comparer)(context,pWVar9,b_00);
      break;
    default:
      goto switchD_00b006e7_default;
    }
    if (iVar1 < 0) {
      QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                (b_00,pWVar9,size);
      return;
    }
  }
switchD_00b006e7_default:
  return;
code_r0x00b00429:
  pWVar10 = base + (nmemb >> 2) * size;
  iVar1 = (*comparer)(context,pWVar10,base);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (base,pWVar10,size);
  }
  uVar2 = (nmemb - 1) * size;
  pWVar7 = base + uVar2;
  pWVar3 = base + (nmemb * 3 >> 2) * size;
  iVar1 = (*comparer)(context,pWVar7,pWVar3);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar3,pWVar7,size);
  }
  uVar8 = (nmemb >> 1) * size;
  pWVar9 = base + uVar8;
  iVar1 = (*comparer)(context,pWVar7,pWVar9);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar9,pWVar7,size);
  }
  iVar1 = (*comparer)(context,pWVar3,pWVar9);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar9,pWVar3,size);
  }
  iVar1 = (*comparer)(context,pWVar3,base);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (base,pWVar3,size);
  }
  iVar1 = (*comparer)(context,pWVar9,base);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (base,pWVar9,size);
  }
  iVar1 = (*comparer)(context,pWVar7,pWVar10);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar10,pWVar7,size);
  }
  iVar1 = (*comparer)(context,pWVar3,pWVar10);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar10,pWVar3,size);
  }
  iVar1 = (*comparer)(context,pWVar9,pWVar10);
  if (iVar1 < 0) {
    QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
              (pWVar10,pWVar9,size);
  }
  QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
            (pWVar7,pWVar9,size);
  if (uVar8 == 0) {
    nmemb_00 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    nmemb_00 = 0;
    pWVar10 = base;
    do {
      iVar1 = (*comparer)(context,pWVar10,pWVar7);
      if (iVar1 < 1) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,base + nmemb_00 * size,size);
        nmemb_00 = nmemb_00 + 1;
      }
      uVar6 = uVar6 + size;
      pWVar10 = pWVar10 + size;
    } while (uVar6 < uVar8);
  }
  if (uVar6 < uVar2) {
    pWVar10 = base + uVar6;
    do {
      iVar1 = (*comparer)(context,pWVar10,pWVar7);
      if (iVar1 < 0) {
        QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
                  (pWVar10,base + nmemb_00 * size,size);
        nmemb_00 = nmemb_00 + 1;
      }
      uVar6 = uVar6 + size;
      pWVar10 = pWVar10 + size;
    } while (uVar6 < uVar2);
  }
  QuickSortSwap<Memory::_write_barrier_policy,_Memory::WriteBarrierPtr<void>_>::swap
            (base + nmemb_00 * size,pWVar7,size);
  Sort(base,nmemb_00,size,comparer,context);
  nmemb = nmemb - (nmemb_00 + 1);
  base = base + (nmemb_00 + 1) * size;
  goto LAB_00b00412;
}

Assistant:

static void Sort(T* base, size_t nmemb, size_t size, Comparer comparer, void* context)
        {
            if (!base)
            {
                return;
            }

            if (nmemb <= 9) // use sorting networks for members <= 2^3
            {
                switch(nmemb)
                {
                    case 9:
                        CCQ_SORT9()
                        break;
                    case 8:
                        CCQ_SORT8()
                        break;
                    case 7:
                        CCQ_SORT7()
                        break;
                    case 6:
                        CCQ_SORT6()
                        break;
                    case 5:
                        CCQ_SORT5(0, 1, 2, 3, 4)
                        break;
                    case 4:
                        CCQ_SORT4()
                        break;
                    case 3:
                        CCQ_SORT3()
                        break;
                    case 2:
                        CCQ_SORT2(0, 1)
                        break;
                    default:
                        break; // nothing to sort
                }

                return;
            }

            CCQ_SORT5(0, (nmemb / 4), (nmemb / 2), ((3 * nmemb) / 4), (nmemb - 1));
            // guess the median is in the middle now.
            size_t pos = 0;
            const size_t pivot = (nmemb - 1) * size;
            // make last element the median(pivot)
            CCQ_SWAP(base + pivot, base + ((nmemb / 2) * size), size);

            // standard qsort pt. below
            size_t i = 0;
            for (; i < nmemb / 2 * size; i+= size)
            {
                // During the first half, count equal values as below the pivot
                if (comparer(context, base + i, base + pivot) <= 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            for (; i < pivot; i+= size)
            {
                // During the second half, count equal values as above the pivot
                if (comparer(context, base + i, base + pivot) < 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            // issue the last change
            CCQ_SWAP(base + (pos * size), base + pivot, size);

            Sort(base, pos++, size, comparer, context);
            Sort(base + (pos * size), nmemb - pos, size, comparer, context);
        }